

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

handle __thiscall pybind11::iterator::operator*(iterator *this)

{
  iterator *self;
  iterator *this_local;
  
  if (((this->ready & 1U) == 0) && ((this->super_object).super_handle.m_ptr != (PyObject *)0x0)) {
    advance(this);
    this->ready = true;
  }
  return (handle)(this->value).super_handle.m_ptr;
}

Assistant:

handle operator*() const {
        if (!ready && m_ptr) {
            auto& self = const_cast<iterator &>(*this);
            self.advance();
            self.ready = true;
        }
        return value;
    }